

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharMap.h
# Opt level: O0

void __thiscall
UnifiedRegex::CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::Inner::Set
          (Inner *this,ArenaAllocator *allocator,int defv,int level,uint k,int v)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  Node *pNVar5;
  uint i;
  int v_local;
  uint k_local;
  int level_local;
  int defv_local;
  ArenaAllocator *allocator_local;
  Inner *this_local;
  
  if (level < 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharMap.h"
                       ,0xb6,"(level > 0)","level > 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  uVar3 = innerIdx(level,k);
  if (this->children[uVar3] == (Node *)0x0) {
    if (v == defv) {
      return;
    }
    pNVar5 = Node::For(allocator,level - 1U,defv);
    this->children[uVar3] = pNVar5;
  }
  (*this->children[uVar3]->_vptr_Node[1])
            (this->children[uVar3],allocator,(ulong)(uint)defv,(ulong)(level - 1U),(ulong)k,
             (ulong)(uint)v);
  return;
}

Assistant:

void Set(ArenaAllocator* allocator, V defv, int level, uint k, V v) override
            {
                Assert(level > 0);
                uint i = innerIdx(level--, k);
                if (children[i] == 0)
                {
                    if (v == defv)
                        return;
                    children[i] = Node::For(allocator, level, defv);
                }
                children[i]->Set(allocator, defv, level, k, v);
            }